

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void QPDF::compute_encryption_parameters_V5
               (char *user_password,char *owner_password,int V,int R,int key_len,int P,
               bool encrypt_metadata,string *id1,string *encryption_key,string *O,string *U,
               string *OE,string *UE,string *Perms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *encryption_key_00;
  allocator<char> local_23a;
  allocator<char> local_239;
  string validation_salt;
  string local_218;
  string key_salt;
  string intermediate_key;
  string local_1a8;
  char k_1 [16];
  string local_178;
  char k_2 [16];
  uchar k [32];
  EncryptionData data;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validation_salt,"",(allocator<char> *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>((string *)&key_salt,"",(allocator<char> *)k);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&intermediate_key,"",(allocator<char> *)k_2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",(allocator<char> *)k_1)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_23a);
  EncryptionData::EncryptionData
            (&data,V,R,key_len,P,&validation_salt,&key_salt,&intermediate_key,&local_218,&local_1a8,
             id1,encrypt_metadata);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&key_salt);
  std::__cxx11::string::~string((string *)&validation_salt);
  QUtil::initializeWithRandomBytes(k,0x20);
  paVar1 = &validation_salt.field_2;
  validation_salt._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&validation_salt,k,&data);
  std::__cxx11::string::operator=((string *)encryption_key,(string *)&validation_salt);
  std::__cxx11::string::~string((string *)&validation_salt);
  std::__cxx11::string::string<std::allocator<char>>((string *)k_2,user_password,&local_239);
  QUtil::initializeWithRandomBytes((uchar *)k_1,0x10);
  validation_salt.field_2._0_1_ = k_1[0];
  validation_salt.field_2._1_1_ = k_1[1];
  validation_salt.field_2._2_1_ = k_1[2];
  validation_salt.field_2._3_1_ = k_1[3];
  validation_salt.field_2._4_1_ = k_1[4];
  validation_salt.field_2._5_1_ = k_1[5];
  validation_salt.field_2._6_1_ = k_1[6];
  validation_salt.field_2._7_1_ = k_1[7];
  validation_salt._M_string_length = 8;
  validation_salt.field_2._M_local_buf[8] = '\0';
  key_salt.field_2._0_1_ = k_1[8];
  key_salt.field_2._1_1_ = k_1[9];
  key_salt.field_2._2_1_ = k_1[10];
  key_salt.field_2._3_1_ = k_1[0xb];
  key_salt.field_2._4_1_ = k_1[0xc];
  key_salt.field_2._5_1_ = k_1[0xd];
  key_salt.field_2._6_1_ = k_1[0xe];
  key_salt.field_2._7_1_ = k_1[0xf];
  key_salt._M_string_length = 8;
  key_salt.field_2._M_local_buf[8] = '\0';
  validation_salt._M_dataplus._M_p = (pointer)paVar1;
  key_salt._M_dataplus._M_p = (pointer)&key_salt.field_2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_23a);
  hash_V5(&local_1a8,(string *)k_2,&validation_salt,&local_178,&data);
  std::operator+(&local_218,&local_1a8,&validation_salt);
  std::operator+(&intermediate_key,&local_218,&key_salt);
  std::__cxx11::string::operator=((string *)U,(string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"",(allocator<char> *)&local_1a8);
  hash_V5(&intermediate_key,(string *)k_2,&key_salt,&local_218,&data);
  std::__cxx11::string::~string((string *)&local_218);
  process_with_aes(&local_218,&intermediate_key,true,encryption_key,0,1,(uchar *)0x0,0);
  std::__cxx11::string::operator=((string *)UE,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&key_salt);
  std::__cxx11::string::~string((string *)&validation_salt);
  std::__cxx11::string::~string((string *)k_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,owner_password,(allocator<char> *)k_1);
  QUtil::initializeWithRandomBytes((uchar *)k_2,0x10);
  validation_salt.field_2._0_1_ = k_2[0];
  validation_salt.field_2._1_1_ = k_2[1];
  validation_salt.field_2._2_1_ = k_2[2];
  validation_salt.field_2._3_1_ = k_2[3];
  validation_salt.field_2._4_1_ = k_2[4];
  validation_salt.field_2._5_1_ = k_2[5];
  validation_salt.field_2._6_1_ = k_2[6];
  validation_salt.field_2._7_1_ = k_2[7];
  validation_salt._M_string_length = 8;
  validation_salt.field_2._M_local_buf[8] = '\0';
  key_salt.field_2._0_1_ = k_2[8];
  key_salt.field_2._1_1_ = k_2[9];
  key_salt.field_2._2_1_ = k_2[10];
  key_salt.field_2._3_1_ = k_2[0xb];
  key_salt.field_2._4_1_ = k_2[0xc];
  key_salt.field_2._5_1_ = k_2[0xd];
  key_salt.field_2._6_1_ = k_2[0xe];
  key_salt.field_2._7_1_ = k_2[0xf];
  key_salt._M_string_length = 8;
  key_salt.field_2._M_local_buf[8] = '\0';
  validation_salt._M_dataplus._M_p = (pointer)paVar1;
  key_salt._M_dataplus._M_p = (pointer)&key_salt.field_2;
  hash_V5(&local_1a8,&local_178,&validation_salt,U,&data);
  std::operator+(&local_218,&local_1a8,&validation_salt);
  std::operator+(&intermediate_key,&local_218,&key_salt);
  std::__cxx11::string::operator=((string *)O,(string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1a8);
  hash_V5(&intermediate_key,&local_178,&key_salt,U,&data);
  process_with_aes(&local_218,&intermediate_key,true,encryption_key,0,1,(uchar *)0x0,0);
  std::__cxx11::string::operator=((string *)OE,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&key_salt);
  std::__cxx11::string::~string((string *)&validation_salt);
  encryption_key_00 = &local_178;
  std::__cxx11::string::~string((string *)encryption_key_00);
  compute_Perms_value_V5_clear(encryption_key_00,&data,(uchar *)&intermediate_key);
  validation_salt._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&validation_salt,&intermediate_key,&intermediate_key.field_2);
  process_with_aes(&key_salt,encryption_key,true,&validation_salt,0,1,(uchar *)0x0,0);
  std::__cxx11::string::~string((string *)&validation_salt);
  std::__cxx11::string::operator=((string *)Perms,(string *)&key_salt);
  std::__cxx11::string::~string((string *)&key_salt);
  EncryptionData::setV5EncryptionParameters(&data,O,OE,U,UE,Perms);
  EncryptionData::~EncryptionData(&data);
  return;
}

Assistant:

void
QPDF::compute_encryption_parameters_V5(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    int P,
    bool encrypt_metadata,
    std::string const& id1,
    std::string& encryption_key,
    std::string& O,
    std::string& U,
    std::string& OE,
    std::string& UE,
    std::string& Perms)
{
    EncryptionData data(V, R, key_len, P, "", "", "", "", "", id1, encrypt_metadata);
    unsigned char k[key_bytes];
    QUtil::initializeWithRandomBytes(k, key_bytes);
    encryption_key = std::string(reinterpret_cast<char*>(k), key_bytes);
    compute_U_UE_value_V5(user_password, encryption_key, data, U, UE);
    compute_O_OE_value_V5(owner_password, encryption_key, data, U, O, OE);
    Perms = compute_Perms_value_V5(encryption_key, data);
    data.setV5EncryptionParameters(O, OE, U, UE, Perms);
}